

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void char_callback(GLFWwindow *window,uint codepoint)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  double dVar4;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  dVar4 = glfwGetTime();
  get_character_string(codepoint);
  printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",dVar4,(ulong)uVar2,(ulong)uVar1,
         codepoint,get_character_string::result);
  return;
}

Assistant:

static void char_callback(GLFWwindow* window, unsigned int codepoint)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    printf("%08x to %i at %0.3f: Character 0x%08x (%s) input\n",
           counter++, slot->number, glfwGetTime(), codepoint,
           get_character_string(codepoint));
}